

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coins.cpp
# Opt level: O3

bool __thiscall
CCoinsViewCache::BatchWrite(CCoinsViewCache *this,CoinsViewCacheCursor *cursor,uint256 *hashBlockIn)

{
  prevector<28U,_unsigned_char,_unsigned_int,_int> *ppVar1;
  CCoinsMap *this_00;
  bool bVar2;
  uint uVar3;
  long lVar4;
  long lVar5;
  CoinsCachePair *pCVar6;
  CoinsCachePair *pCVar7;
  char *pcVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  byte bVar12;
  _Node_iterator_base<std::pair<const_COutPoint,_CCoinsCacheEntry>,_false> __it;
  ulong uVar13;
  logic_error *this_01;
  ulong uVar14;
  CoinsCachePair *__k;
  long in_FS_OFFSET;
  pair<std::__detail::_Node_iterator<std::pair<const_COutPoint,_CCoinsCacheEntry>,_false,_false>,_bool>
  pVar15;
  
  lVar4 = *(long *)(in_FS_OFFSET + 0x28);
  __k = (cursor->m_sentinel->second).m_next;
  if (__k != cursor->m_sentinel) {
    this_00 = &this->cacheCoins;
    do {
      if (((__k->second).m_flags & 1) != 0) {
        __it._M_cur = (__node_type *)
                      std::
                      _Hashtable<COutPoint,_std::pair<const_COutPoint,_CCoinsCacheEntry>,_PoolAllocator<std::pair<const_COutPoint,_CCoinsCacheEntry>,_144UL,_8UL>,_std::__detail::_Select1st,_std::equal_to<COutPoint>,_SaltedOutpointHasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                      ::find(&this_00->_M_h,&__k->first);
        bVar12 = (__k->second).m_flags;
        if (__it._M_cur == (__node_type *)0x0) {
          if (((bVar12 & 2) == 0) || ((__k->second).coin.out.nValue != -1)) {
            pVar15 = std::__detail::
                     _Insert_base<COutPoint,std::pair<COutPoint_const,CCoinsCacheEntry>,PoolAllocator<std::pair<COutPoint_const,CCoinsCacheEntry>,144ul,8ul>,std::__detail::_Select1st,std::equal_to<COutPoint>,SaltedOutpointHasher,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                     ::try_emplace<COutPoint_const&>
                               ((_Insert_base<COutPoint,std::pair<COutPoint_const,CCoinsCacheEntry>,PoolAllocator<std::pair<COutPoint_const,CCoinsCacheEntry>,144ul,8ul>,std::__detail::_Select1st,std::equal_to<COutPoint>,SaltedOutpointHasher,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                                 *)this_00,(const_iterator)0x0,&__k->first);
            __it._M_cur = (__node_type *)
                          pVar15.first.
                          super__Node_iterator_base<std::pair<const_COutPoint,_CCoinsCacheEntry>,_false>
                          ._M_cur;
            lVar5 = (__k->second).coin.out.nValue;
            ppVar1 = (prevector<28U,_unsigned_char,_unsigned_int,_int> *)((long)__it._M_cur + 0x50);
            bVar2 = cursor->m_will_erase;
            *(long *)((long)__it._M_cur + 0x48) = lVar5;
            if ((bVar2 == false) && (lVar5 != -1)) {
              prevector<28U,_unsigned_char,_unsigned_int,_int>::operator=
                        (ppVar1,&(__k->second).coin.out.scriptPubKey.super_CScriptBase);
            }
            else {
              if (0x1c < *(uint *)((long)__it._M_cur + 0x6c)) {
                free((ppVar1->_union).indirect_contents.indirect);
              }
              pcVar8 = (__k->second).coin.out.scriptPubKey.super_CScriptBase._union.
                       indirect_contents.indirect;
              uVar9 = *(undefined8 *)
                       ((long)&(__k->second).coin.out.scriptPubKey.super_CScriptBase._union + 8);
              uVar10 = *(undefined8 *)
                        ((long)&(__k->second).coin.out.scriptPubKey.super_CScriptBase._union + 0x14)
              ;
              *(undefined8 *)((long)__it._M_cur + 0x5c) =
                   *(undefined8 *)
                    ((long)&(__k->second).coin.out.scriptPubKey.super_CScriptBase._union + 0xc);
              *(undefined8 *)((long)__it._M_cur + 100) = uVar10;
              (ppVar1->_union).indirect_contents.indirect = pcVar8;
              *(undefined8 *)((long)__it._M_cur + 0x58) = uVar9;
              *(size_type *)((long)__it._M_cur + 0x6c) =
                   (__k->second).coin.out.scriptPubKey.super_CScriptBase._size;
              (__k->second).coin.out.scriptPubKey.super_CScriptBase._size = 0;
            }
            *(undefined4 *)((long)__it._M_cur + 0x70) =
                 *(undefined4 *)&(__k->second).coin.field_0x28;
            uVar14 = (ulong)*(uint *)((long)__it._M_cur + 0x58);
            if (*(uint *)((long)__it._M_cur + 0x6c) < 0x1d) {
              uVar14 = 0;
            }
            uVar13 = 0;
            if ((int)uVar14 != 0) {
              uVar13 = uVar14 + 0x1f & 0x1fffffff0;
            }
            this->cachedCoinsUsage = this->cachedCoinsUsage + uVar13;
            bVar12 = *(byte *)((long)__it._M_cur + 0x40);
            if (bVar12 == 0) {
              *(CoinsCachePair **)((long)__it._M_cur + 0x30) = (this->m_sentinel).second.m_prev;
              *(CoinsCachePair **)((long)__it._M_cur + 0x38) = &this->m_sentinel;
              (this->m_sentinel).second.m_prev = (CoinsCachePair *)((long)__it._M_cur + 8);
              *(CoinsCachePair **)(*(long *)((long)__it._M_cur + 0x30) + 0x30) =
                   (CoinsCachePair *)((long)__it._M_cur + 8);
            }
            *(byte *)((long)__it._M_cur + 0x40) = bVar12 | 1;
            if (((__k->second).m_flags & 2) != 0) {
              bVar12 = bVar12 | 3;
              goto LAB_006631fb;
            }
          }
        }
        else {
          if (((bVar12 & 2) != 0) && (*(long *)((long)__it._M_cur + 0x48) != -1)) {
            this_01 = (logic_error *)__cxa_allocate_exception(0x10);
            std::logic_error::logic_error
                      (this_01,"FRESH flag misapplied to coin that exists in parent cache");
            if (*(long *)(in_FS_OFFSET + 0x28) == lVar4) {
              __cxa_throw(this_01,&std::logic_error::typeinfo,std::logic_error::~logic_error);
            }
            goto LAB_0066335c;
          }
          if (((*(byte *)((long)__it._M_cur + 0x40) & 2) == 0) ||
             ((__k->second).coin.out.nValue != -1)) {
            uVar3 = *(uint *)((long)__it._M_cur + 0x6c);
            uVar14 = (ulong)*(uint *)((long)__it._M_cur + 0x58);
            if (uVar3 < 0x1d) {
              uVar14 = 0;
            }
            uVar13 = 0;
            if ((int)uVar14 != 0) {
              uVar13 = uVar14 + 0x1f & 0x1fffffff0;
            }
            this->cachedCoinsUsage = this->cachedCoinsUsage - uVar13;
            lVar5 = (__k->second).coin.out.nValue;
            ppVar1 = (prevector<28U,_unsigned_char,_unsigned_int,_int> *)((long)__it._M_cur + 0x50);
            bVar2 = cursor->m_will_erase;
            *(long *)((long)__it._M_cur + 0x48) = lVar5;
            if ((bVar2 == false) && (lVar5 != -1)) {
              prevector<28U,_unsigned_char,_unsigned_int,_int>::operator=
                        (ppVar1,&(__k->second).coin.out.scriptPubKey.super_CScriptBase);
            }
            else {
              if (0x1c < uVar3) {
                free((ppVar1->_union).indirect_contents.indirect);
              }
              pcVar8 = (__k->second).coin.out.scriptPubKey.super_CScriptBase._union.
                       indirect_contents.indirect;
              uVar9 = *(undefined8 *)
                       ((long)&(__k->second).coin.out.scriptPubKey.super_CScriptBase._union + 8);
              uVar10 = *(undefined8 *)
                        ((long)&(__k->second).coin.out.scriptPubKey.super_CScriptBase._union + 0x14)
              ;
              *(undefined8 *)((long)__it._M_cur + 0x5c) =
                   *(undefined8 *)
                    ((long)&(__k->second).coin.out.scriptPubKey.super_CScriptBase._union + 0xc);
              *(undefined8 *)((long)__it._M_cur + 100) = uVar10;
              (ppVar1->_union).indirect_contents.indirect = pcVar8;
              *(undefined8 *)((long)__it._M_cur + 0x58) = uVar9;
              *(size_type *)((long)__it._M_cur + 0x6c) =
                   (__k->second).coin.out.scriptPubKey.super_CScriptBase._size;
              (__k->second).coin.out.scriptPubKey.super_CScriptBase._size = 0;
            }
            *(undefined4 *)((long)__it._M_cur + 0x70) =
                 *(undefined4 *)&(__k->second).coin.field_0x28;
            uVar14 = (ulong)*(uint *)((long)__it._M_cur + 0x58);
            if (*(uint *)((long)__it._M_cur + 0x6c) < 0x1d) {
              uVar14 = 0;
            }
            uVar13 = 0;
            if ((int)uVar14 != 0) {
              uVar13 = uVar14 + 0x1f & 0x1fffffff0;
            }
            this->cachedCoinsUsage = this->cachedCoinsUsage + uVar13;
            bVar12 = *(byte *)((long)__it._M_cur + 0x40);
            if (bVar12 == 0) {
              *(CoinsCachePair **)((long)__it._M_cur + 0x30) = (this->m_sentinel).second.m_prev;
              *(CoinsCachePair **)((long)__it._M_cur + 0x38) = &this->m_sentinel;
              (this->m_sentinel).second.m_prev = (CoinsCachePair *)((long)__it._M_cur + 8);
              *(CoinsCachePair **)(*(long *)((long)__it._M_cur + 0x30) + 0x30) =
                   (CoinsCachePair *)((long)__it._M_cur + 8);
            }
            bVar12 = bVar12 | 1;
LAB_006631fb:
            ((__it._M_cur)->
            super__Hash_node_value<std::pair<const_COutPoint,_CCoinsCacheEntry>,_false>).
            super__Hash_node_value_base<std::pair<const_COutPoint,_CCoinsCacheEntry>_>._M_storage.
            _M_storage.__data[0x38] = bVar12;
          }
          else {
            uVar14 = (ulong)*(uint *)((long)__it._M_cur + 0x58);
            if (*(uint *)((long)__it._M_cur + 0x6c) < 0x1d) {
              uVar14 = 0;
            }
            uVar13 = 0;
            if ((int)uVar14 != 0) {
              uVar13 = uVar14 + 0x1f & 0x1fffffff0;
            }
            this->cachedCoinsUsage = this->cachedCoinsUsage - uVar13;
            std::
            _Hashtable<COutPoint,_std::pair<const_COutPoint,_CCoinsCacheEntry>,_PoolAllocator<std::pair<const_COutPoint,_CCoinsCacheEntry>,_144UL,_8UL>,_std::__detail::_Select1st,_std::equal_to<COutPoint>,_SaltedOutpointHasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
            ::erase(&this_00->_M_h,(const_iterator)__it._M_cur);
          }
        }
      }
      pCVar6 = (__k->second).m_next;
      if (cursor->m_will_erase == false) {
        if ((__k->second).coin.out.nValue == -1) {
          uVar14 = (ulong)(__k->second).coin.out.scriptPubKey.super_CScriptBase._union.
                          indirect_contents.capacity;
          if ((__k->second).coin.out.scriptPubKey.super_CScriptBase._size < 0x1d) {
            uVar14 = 0;
          }
          uVar13 = 0;
          if ((int)uVar14 != 0) {
            uVar13 = uVar14 + 0x1f & 0x1fffffff0;
          }
          *cursor->m_usage = *cursor->m_usage - uVar13;
          std::
          _Hashtable<COutPoint,_std::pair<const_COutPoint,_CCoinsCacheEntry>,_PoolAllocator<std::pair<const_COutPoint,_CCoinsCacheEntry>,_144UL,_8UL>,_std::__detail::_Select1st,_std::equal_to<COutPoint>,_SaltedOutpointHasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
          ::_M_erase(&cursor->m_map->_M_h,__k);
        }
        else if ((__k->second).m_flags != '\0') {
          pCVar7 = (__k->second).m_prev;
          (pCVar6->second).m_prev = pCVar7;
          (pCVar7->second).m_next = pCVar6;
          (__k->second).m_flags = '\0';
        }
      }
      __k = pCVar6;
    } while (pCVar6 != cursor->m_sentinel);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar4) {
    uVar9 = *(undefined8 *)(hashBlockIn->super_base_blob<256U>).m_data._M_elems;
    uVar10 = *(undefined8 *)((hashBlockIn->super_base_blob<256U>).m_data._M_elems + 8);
    uVar11 = *(undefined8 *)((hashBlockIn->super_base_blob<256U>).m_data._M_elems + 0x18);
    *(undefined8 *)((this->hashBlock).super_base_blob<256U>.m_data._M_elems + 0x10) =
         *(undefined8 *)((hashBlockIn->super_base_blob<256U>).m_data._M_elems + 0x10);
    *(undefined8 *)((this->hashBlock).super_base_blob<256U>.m_data._M_elems + 0x18) = uVar11;
    *(undefined8 *)(this->hashBlock).super_base_blob<256U>.m_data._M_elems = uVar9;
    *(undefined8 *)((this->hashBlock).super_base_blob<256U>.m_data._M_elems + 8) = uVar10;
    return true;
  }
LAB_0066335c:
  __stack_chk_fail();
}

Assistant:

bool CCoinsViewCache::BatchWrite(CoinsViewCacheCursor& cursor, const uint256 &hashBlockIn) {
    for (auto it{cursor.Begin()}; it != cursor.End(); it = cursor.NextAndMaybeErase(*it)) {
        // Ignore non-dirty entries (optimization).
        if (!it->second.IsDirty()) {
            continue;
        }
        CCoinsMap::iterator itUs = cacheCoins.find(it->first);
        if (itUs == cacheCoins.end()) {
            // The parent cache does not have an entry, while the child cache does.
            // We can ignore it if it's both spent and FRESH in the child
            if (!(it->second.IsFresh() && it->second.coin.IsSpent())) {
                // Create the coin in the parent cache, move the data up
                // and mark it as dirty.
                itUs = cacheCoins.try_emplace(it->first).first;
                CCoinsCacheEntry& entry{itUs->second};
                if (cursor.WillErase(*it)) {
                    // Since this entry will be erased,
                    // we can move the coin into us instead of copying it
                    entry.coin = std::move(it->second.coin);
                } else {
                    entry.coin = it->second.coin;
                }
                cachedCoinsUsage += entry.coin.DynamicMemoryUsage();
                entry.AddFlags(CCoinsCacheEntry::DIRTY, *itUs, m_sentinel);
                // We can mark it FRESH in the parent if it was FRESH in the child
                // Otherwise it might have just been flushed from the parent's cache
                // and already exist in the grandparent
                if (it->second.IsFresh()) {
                    entry.AddFlags(CCoinsCacheEntry::FRESH, *itUs, m_sentinel);
                }
            }
        } else {
            // Found the entry in the parent cache
            if (it->second.IsFresh() && !itUs->second.coin.IsSpent()) {
                // The coin was marked FRESH in the child cache, but the coin
                // exists in the parent cache. If this ever happens, it means
                // the FRESH flag was misapplied and there is a logic error in
                // the calling code.
                throw std::logic_error("FRESH flag misapplied to coin that exists in parent cache");
            }

            if (itUs->second.IsFresh() && it->second.coin.IsSpent()) {
                // The grandparent cache does not have an entry, and the coin
                // has been spent. We can just delete it from the parent cache.
                cachedCoinsUsage -= itUs->second.coin.DynamicMemoryUsage();
                cacheCoins.erase(itUs);
            } else {
                // A normal modification.
                cachedCoinsUsage -= itUs->second.coin.DynamicMemoryUsage();
                if (cursor.WillErase(*it)) {
                    // Since this entry will be erased,
                    // we can move the coin into us instead of copying it
                    itUs->second.coin = std::move(it->second.coin);
                } else {
                    itUs->second.coin = it->second.coin;
                }
                cachedCoinsUsage += itUs->second.coin.DynamicMemoryUsage();
                itUs->second.AddFlags(CCoinsCacheEntry::DIRTY, *itUs, m_sentinel);
                // NOTE: It isn't safe to mark the coin as FRESH in the parent
                // cache. If it already existed and was spent in the parent
                // cache then marking it FRESH would prevent that spentness
                // from being flushed to the grandparent.
            }
        }
    }
    hashBlock = hashBlockIn;
    return true;
}